

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_save_file(uchar *buffer,size_t buffersize,char *filename)

{
  uint uVar1;
  FILE *__s;
  
  __s = fopen(filename,"wb");
  if (__s == (FILE *)0x0) {
    uVar1 = 0x4f;
  }
  else {
    fwrite(buffer,1,buffersize,__s);
    fclose(__s);
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

unsigned lodepng_save_file(const unsigned char* buffer, size_t buffersize, const char* filename)
{
	FILE* file;
	file = fopen(filename, "wb");
	if (!file) return 79;
	fwrite((char*)buffer, 1, buffersize, file);
	fclose(file);
	return 0;
}